

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg7.c
# Opt level: O3

_Bool borg_enchant_to_h(void)

{
  short sVar1;
  bool bVar2;
  _Bool _Var3;
  ulong uVar4;
  borg_item *pbVar5;
  borg_item *pbVar6;
  int *piVar7;
  wchar_t i;
  int iVar8;
  long lVar9;
  ulong uVar10;
  int local_34;
  
  if ((my_need_enchant_to_h == 0) && (enchant_weapon_swap_to_h == L'\0')) {
    return false;
  }
  if ((borg_skill[0xd3] == 0) && (borg_skill[0xd5] == 0)) {
    return false;
  }
  lVar9 = (ulong)z_info->pack_size * 0x388 + 0x5c;
  local_34 = 99;
  i = L'\xffffffff';
  pbVar6 = borg_items;
  uVar4 = (ulong)z_info->pack_size;
  do {
    pbVar5 = pbVar6;
    if (((pbVar6->desc[lVar9 + 8] != '\0') && (pbVar6->desc[lVar9] == '\x01')) &&
       (pbVar6->desc[lVar9 + 4] != '\x06')) {
      sVar1 = *(short *)(pbVar6->desc + lVar9 + 0x18);
      iVar8 = (int)sVar1;
      _Var3 = borg_spell_okay_fail(ENCHANT_WEAPON,L'A');
      pbVar5 = borg_items;
      if ((_Var3) || (0 < borg_skill[0xd5])) {
        if (iVar8 < borg_cfg[0x1c]) goto LAB_0023a1df;
      }
      else if (sVar1 < 8) {
LAB_0023a1df:
        if (((uVar4 != (ulong)z_info->pack_size + 1) || (2 < borg_skill[0x8a])) ||
           ((pbVar6->desc[lVar9 + 0xc] != '\0' || (pbVar6->desc[lVar9 + 0xd] != '\0')))) {
          bVar2 = iVar8 <= local_34;
          if (i < L'\0' || bVar2) {
            local_34 = iVar8;
          }
          if (i < L'\0' || bVar2) {
            i = (wchar_t)uVar4;
          }
        }
      }
    }
    lVar9 = lVar9 + 0x388;
    bVar2 = uVar4 <= z_info->pack_size;
    pbVar6 = pbVar5;
    uVar4 = uVar4 + 1;
  } while (bVar2);
  lVar9 = (long)weapon_swap;
  if (((lVar9 != 0) && (borg_items[lVar9 + -1].ident == true)) &&
     (borg_items[lVar9 + -1].tval != '\x06')) {
    sVar1 = borg_items[lVar9 + -1].to_h;
    iVar8 = (int)sVar1;
    _Var3 = borg_spell_okay_fail(ENCHANT_WEAPON,L'A');
    if ((_Var3) || (0 < borg_skill[0xd5])) {
      bVar2 = borg_cfg[0x1c] <= iVar8;
    }
    else {
      bVar2 = 7 < sVar1;
    }
    if ((iVar8 < local_34) && (!bVar2)) {
      i = weapon_swap + L'\xffffffff';
      local_34 = iVar8;
    }
  }
  if (i < L'\0') {
    if (z_info->quiver_size == 0) {
      return false;
    }
    uVar4 = (ulong)z_info->pack_size;
    uVar10 = uVar4 + 0xc;
    lVar9 = uVar4 * 0x388 + 0x2abc;
    pbVar6 = borg_items;
    piVar7 = borg_skill;
    do {
      if ((2 < piVar7[0x8a]) &&
         ((((pbVar6[uVar4 + 1].art_idx != '\0' || (pbVar6[uVar4 + 1].ego_idx != '\0')) &&
           (4 < (byte)pbVar6->desc[lVar9 + 8])) &&
          ((pbVar6->desc[lVar9] == '\x01' && (piVar7[0x88] == (uint)(byte)pbVar6->desc[lVar9 + 4])))
          ))) {
        sVar1 = *(short *)(pbVar6->desc + lVar9 + 0x18);
        iVar8 = (int)sVar1;
        _Var3 = borg_spell_okay_fail(ENCHANT_WEAPON,L'A');
        pbVar6 = borg_items;
        piVar7 = borg_skill;
        if ((_Var3) || (0 < borg_skill[0xd5])) {
          if (sVar1 < 10) goto LAB_0023a3e3;
        }
        else if (sVar1 < 8) {
LAB_0023a3e3:
          bVar2 = iVar8 <= local_34;
          if (i < L'\0' || bVar2) {
            local_34 = iVar8;
          }
          if (i < L'\0' || bVar2) {
            i = (wchar_t)uVar10;
          }
        }
      }
      uVar10 = uVar10 + 1;
      uVar4 = (ulong)z_info->pack_size;
      lVar9 = lVar9 + 0x388;
    } while (uVar10 < z_info->quiver_size + uVar4 + 0xc);
    if (i < L'\0') {
      return false;
    }
  }
  _Var3 = borg_read_scroll(sv_scroll_star_enchant_weapon);
  if (((!_Var3) && (_Var3 = borg_read_scroll(sv_scroll_enchant_weapon_to_hit), !_Var3)) &&
     (_Var3 = borg_spell_fail(ENCHANT_WEAPON,L'A'), !_Var3)) {
    return false;
  }
  borg_pick_weapon(i);
  return true;
}

Assistant:

static bool borg_enchant_to_h(void)
{
    int i, b_i = -1;
    int a, s_a, b_a = 99;

    /* Nothing to enchant */
    if (!my_need_enchant_to_h && !enchant_weapon_swap_to_h)
        return (false);

    /* Need "enchantment" ability */
    if ((!borg_skill[BI_AENCH_TOH]) && (!borg_skill[BI_AENCH_SWEP]))
        return (false);

    /* Look for a weapon that needs enchanting */
    for (i = INVEN_WIELD; i <= INVEN_BOW; i++) {
        borg_item* item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Skip non-identified items */
        if (!item->ident)
            continue;

        /* Skip my swap digger */
        if (item->tval == TV_DIGGING)
            continue;

        /* Obtain the bonus */
        a = item->to_h;

        /* Skip "boring" items */
        if (borg_spell_okay_fail(ENCHANT_WEAPON, 65)
            || borg_skill[BI_AENCH_SWEP] >= 1) {
            if (a >= borg_cfg[BORG_ENCHANT_LIMIT])
                continue;
        } else {
            if (a >= 8)
                continue;
        }

        /* Most classes store the enchants until they get
         * a 3x shooter (like a long bow).
         * Generally, we do not want the x2 shooter enchanted,
         * since it wastes scrolls.  But if the sword is at +5
         * and the sling at +2, then the sling will be selected
         * because its enchantment is lower.  The borg tries to
         * enchant the least enchanted item.  This will make sure
         * the x2 shooter is skipped and the sword is enchanted,
         * if needed.  If the sword is at +9,+9, and the sling at
         * +0,+0 and the borg has some enchant scrolls, he should
         * store them instead of wasting them on the sling.
         */
        if (i == INVEN_BOW && /* bow */
            borg_skill[BI_AMMO_POWER] < 3 && /* 3x shooter */
            (!item->art_idx && !item->ego_idx)) /* Not artifact or ego */
            continue;

        /* Find the least enchanted item */
        if ((b_i >= 0) && (b_a < a))
            continue;

        /* Save the info */
        b_i = i;
        b_a = a;
    }
    if (weapon_swap) {
        bool skip       = false;
        borg_item* item = &borg_items[weapon_swap - 1];

        /* Skip my swap digger and anything unid'd */
        if (item->ident && item->tval != TV_DIGGING) {
            /* Obtain the bonus */
            s_a = item->to_h;

            /* Skip items that are already enchanted */
            if (borg_spell_okay_fail(ENCHANT_WEAPON, 65)
                || borg_skill[BI_AENCH_SWEP] >= 1) {
                if (s_a >= borg_cfg[BORG_ENCHANT_LIMIT])
                    skip = true;
            } else {
                if (s_a >= 8)
                    skip = true;
            }

            /* Find the least enchanted item */
            if (b_a > s_a && !skip) {
                /* Save the info */
                b_i = weapon_swap - 1;
                b_a = s_a;
            }
        }
    }
    /* Nothing, check ammo */
    if (b_i < 0) {
        /* look through inventory for ammo */
        for (i = QUIVER_START; i < QUIVER_END; i++) {
            borg_item* item = &borg_items[i];

            /* Only enchant ammo if we have a good shooter,
             * otherwise, store the enchants in the home.
             */
            if (borg_skill[BI_AMMO_POWER] < 3
                || (!borg_items[INVEN_BOW].art_idx
                    && !borg_items[INVEN_BOW].ego_idx))
                continue;

            /* Only enchant if qty >= 5 */
            if (item->iqty < 5)
                continue;

            /* Skip non-identified items  */
            if (!item->ident)
                continue;

            /* Make sure it is the right type if missile */
            if (item->tval != borg_skill[BI_AMMO_TVAL])
                continue;

            /* Obtain the bonus  */
            a = item->to_h;

            /* Skip items that are already enchanted */
            if (borg_spell_okay_fail(ENCHANT_WEAPON, 65)
                || borg_skill[BI_AENCH_SWEP] >= 1) {
                if (a >= 10)
                    continue;
            } else {
                if (a >= 8)
                    continue;
            }

            /* Find the least enchanted item */
            if ((b_i >= 0) && (b_a < a))
                continue;

            /* Save the info  */
            b_i = i;
            b_a = a;
        }
    }

    /* Nothing */
    if (b_i < 0)
        return (false);

    /* Enchant it */
    if (borg_read_scroll(sv_scroll_star_enchant_weapon)
        || borg_read_scroll(sv_scroll_enchant_weapon_to_hit)
        || borg_spell_fail(ENCHANT_WEAPON, 65)) {
        borg_pick_weapon(b_i);

        /* Success */
        return (true);
    }

    /* Nothing to do */
    return (false);
}